

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O0

SmallBuffer * __thiscall
helics::CustomTranslatorOperator::convertToValue
          (CustomTranslatorOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  bool bVar1;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *this_00;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_RDX;
  long in_RSI;
  SmallBuffer *in_RDI;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_ffffffffffffff98;
  SmallBuffer *in_stack_ffffffffffffffa0;
  SmallBuffer *this_01;
  
  this_01 = in_RDI;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<helics::SmallBuffer_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
                      *)in_stack_ffffffffffffffa0);
  if (bVar1) {
    this_00 = (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)(in_RSI + 0x10);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
              (this_00,in_stack_ffffffffffffff98);
    std::
    function<helics::SmallBuffer_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
    ::operator()((function<helics::SmallBuffer_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
                  *)this_01,in_RDX);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00);
  }
  else {
    SmallBuffer::SmallBuffer(in_stack_ffffffffffffffa0);
  }
  return in_RDI;
}

Assistant:

SmallBuffer CustomTranslatorOperator::convertToValue(std::unique_ptr<Message> message)
{
    if (toValueFunction) {
        return toValueFunction(std::move(message));
    }
    return {};
}